

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.cpp
# Opt level: O2

string * fs_realpath_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view s;
  size_t __n;
  char *pcVar1;
  string r;
  _Alloc_hider __resolved;
  char *in_stack_ffffffffffffffd0;
  char local_28 [16];
  
  __n = fs_get_max_path();
  __resolved._M_p = local_28;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc8,__n,'\0');
  pcVar1 = realpath(path._M_str,__resolved._M_p);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    s._M_str = in_stack_ffffffffffffffd0;
    s._M_len = (size_t)__resolved._M_p;
    fs_trim_abi_cxx11_(s);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_realpath(std::string_view path)
{
  // resolve real path
  // not well-defined for non-existing path--may return empty string.

#ifdef _WIN32
  return fs_win32_final_path(path);
#else
  std::string r(fs_get_max_path(), '\0');

  return realpath(path.data(), r.data())
    ? fs_trim(r)
    : std::string();
#endif

}